

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

void NGA_Scatter_acc_flat(int g_a,void *v,int *subsArray,int n,void *alpha)

{
  Integer IVar1;
  void *subscript;
  long lVar2;
  ulong uVar3;
  int *piVar4;
  long lVar5;
  
  IVar1 = pnga_ndim((long)g_a);
  subscript = malloc((long)((int)IVar1 * n) << 3);
  if (subscript == (void *)0x0) {
    pnga_error("Memory allocation failed.",0);
  }
  if (0 < n) {
    lVar2 = (long)subscript + -8;
    uVar3 = 0;
    do {
      piVar4 = subsArray;
      lVar5 = IVar1;
      if (0 < IVar1) {
        do {
          *(long *)(lVar2 + lVar5 * 8) = (long)*piVar4 + 1;
          lVar5 = lVar5 + -1;
          piVar4 = piVar4 + 1;
        } while (lVar5 != 0);
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + IVar1 * 8;
      subsArray = subsArray + IVar1;
    } while (uVar3 != (uint)n);
  }
  pnga_scatter_acc((long)g_a,v,subscript,0,(long)n,alpha);
  free(subscript);
  return;
}

Assistant:

void NGA_Scatter_acc_flat(int g_a, void *v, int subsArray[], int n, void *alpha)
{
    int idx, i;
    Integer a = (Integer)g_a;
    Integer nv = (Integer)n;
    Integer ndim = wnga_ndim(a);
    Integer *_subs_array;
    _subs_array = (Integer *)malloc((int)ndim* n * sizeof(Integer));
    if(_subs_array == NULL) GA_Error("Memory allocation failed.", 0);

    /* adjust the indices for fortran interface */
    for(idx=0; idx<n; idx++)
        for(i=0; i<ndim; i++)
            _subs_array[idx*ndim+(ndim-i-1)] = subsArray[idx*ndim+i] + 1;
    
    wnga_scatter_acc(a, v, _subs_array, 0, nv, alpha);
    
    free(_subs_array);
}